

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::NodeScalar::set_ref_maybe_replacing_scalar(NodeScalar *this,csubstr ref,bool has_scalar)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  basic_substring<const_char> local_30;
  
  uVar5 = ref.len;
  pcVar6 = ref.str;
  pcVar3 = pcVar6;
  uVar4 = uVar5;
  if ((uVar5 != 0) && (*pcVar6 == '*')) {
    basic_substring<const_char>::basic_substring(&local_30,pcVar6 + 1,uVar5 - 1);
    pcVar3 = local_30.str;
    uVar4 = local_30.len;
  }
  (this->anchor).str = pcVar3;
  (this->anchor).len = uVar4;
  if ((has_scalar) && (uVar1 = (this->scalar).len, lVar7 = uVar1 - uVar4, uVar4 <= uVar1)) {
    bVar9 = uVar4 == 0;
    if (!bVar9) {
      pcVar2 = (this->scalar).str;
      if (pcVar2[lVar7] != *pcVar3) goto LAB_001f0af9;
      uVar1 = 1;
      do {
        uVar8 = uVar1;
        if (uVar4 == uVar8) break;
        uVar1 = uVar8 + 1;
      } while (pcVar2[uVar8 + lVar7] == pcVar3[uVar8]);
      bVar9 = uVar4 <= uVar8;
    }
    if (bVar9) {
      return;
    }
  }
LAB_001f0af9:
  (this->scalar).str = pcVar6;
  (this->scalar).len = uVar5;
  return;
}

Assistant:

void set_ref_maybe_replacing_scalar(csubstr ref, bool has_scalar) noexcept
    {
        csubstr trimmed = ref.begins_with('*') ? ref.sub(1) : ref;
        anchor = trimmed;
        if((!has_scalar) || !scalar.ends_with(trimmed))
            scalar = ref;
    }